

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::WriteFaceArray(ON_Mesh *this,int vcount,int fcount,ON_BinaryArchive *file)

{
  ON_BinaryArchive *this_00;
  ON_MeshFace *pOVar1;
  bool local_57;
  bool local_56;
  bool local_55;
  int local_44;
  bool local_3d;
  int i;
  bool rc;
  int i_size;
  int *vi;
  undefined2 local_28;
  undefined2 local_26;
  unsigned_short svi [4];
  uchar cvi [4];
  ON_BinaryArchive *file_local;
  int fcount_local;
  int vcount_local;
  ON_Mesh *this_local;
  
  if (vcount < 0x100) {
    i = 1;
  }
  else if (vcount < 0x10000) {
    i = 2;
  }
  else {
    i = 4;
  }
  unique0x10000188 = file;
  local_3d = ON_BinaryArchive::WriteInt(file,i);
  if (i == 1) {
    local_44 = 0;
    while( true ) {
      local_55 = false;
      if (local_44 < fcount) {
        local_55 = local_3d;
      }
      if (local_55 == false) break;
      pOVar1 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,local_44);
      svi[0]._0_1_ = (undefined1)pOVar1->vi[0];
      svi[0]._1_1_ = (undefined1)pOVar1->vi[1];
      svi[1]._0_1_ = (undefined1)pOVar1->vi[2];
      svi[1]._1_1_ = (undefined1)pOVar1->vi[3];
      local_3d = ON_BinaryArchive::WriteChar(stack0xffffffffffffffe0,4,(ON__UINT8 *)svi);
      local_44 = local_44 + 1;
    }
  }
  else if (i == 2) {
    local_44 = 0;
    while( true ) {
      local_56 = false;
      if (local_44 < fcount) {
        local_56 = local_3d;
      }
      if (local_56 == false) break;
      pOVar1 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,local_44);
      vi._4_2_ = (undefined2)pOVar1->vi[0];
      vi._6_2_ = (undefined2)pOVar1->vi[1];
      local_28 = (undefined2)pOVar1->vi[2];
      local_26 = (undefined2)pOVar1->vi[3];
      local_3d = ON_BinaryArchive::WriteShort
                           (stack0xffffffffffffffe0,4,(ON__UINT16 *)((long)&vi + 4));
      local_44 = local_44 + 1;
    }
  }
  else if (i == 4) {
    local_44 = 0;
    while( true ) {
      this_00 = stack0xffffffffffffffe0;
      local_57 = false;
      if (local_44 < fcount) {
        local_57 = local_3d;
      }
      if (local_57 == false) break;
      pOVar1 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,local_44);
      local_3d = ON_BinaryArchive::WriteInt(this_00,4,pOVar1->vi);
      local_44 = local_44 + 1;
    }
  }
  return local_3d;
}

Assistant:

bool ON_Mesh::WriteFaceArray( int vcount, int fcount, ON_BinaryArchive& file ) const
{
  unsigned char  cvi[4];
  unsigned short svi[4];
  const int* vi;
  int i_size = 0;
  if ( vcount < 256 ) {
    i_size = 1; // unsigned chars
  }
  else if (vcount < 65536 ) {
    i_size = 2; // unsigned shorts
  }
  else {
    i_size = 4; // 4 byte ints
  }

  bool rc = file.WriteInt( i_size );
  int i;
  switch(i_size) {
  case 1:
    for ( i = 0; i < fcount && rc ; i++ ) {
      vi = m_F[i].vi;
      cvi[0] = (unsigned char)vi[0];
      cvi[1] = (unsigned char)vi[1];
      cvi[2] = (unsigned char)vi[2];
      cvi[3] = (unsigned char)vi[3];
      rc = file.WriteChar( 4, cvi );
    }
    break;
  case 2:
    for ( i = 0; i < fcount && rc ; i++ ) {
      vi = m_F[i].vi;
      svi[0] = (unsigned short)vi[0];
      svi[1] = (unsigned short)vi[1];
      svi[2] = (unsigned short)vi[2];
      svi[3] = (unsigned short)vi[3];
      rc = file.WriteShort( 4, svi );
    }
    break;
  case 4:
    for ( i = 0; i < fcount && rc ; i++ ) {
      rc = file.WriteInt( 4, m_F[i].vi );
    }
    break;
  }

  return rc;
}